

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O2

void __thiscall
btPoint2PointConstraint::getInfo2NonVirtual
          (btPoint2PointConstraint *this,btConstraintInfo2 *info,btTransform *body0_trans,
          btTransform *body1_trans)

{
  float fVar1;
  float fVar2;
  btScalar bVar3;
  int iVar4;
  uint uVar5;
  btVector3 *pbVar6;
  btScalar *pbVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  btVector3 a2;
  btVector3 a1;
  
  pbVar7 = info->m_J1linearAxis;
  *pbVar7 = 1.0;
  iVar4 = info->rowskip;
  pbVar7[(long)iVar4 + 1] = 1.0;
  pbVar7[(long)iVar4 * 2 + 2] = 1.0;
  a1 = operator*(&body0_trans->m_basis,&this->m_pivotInA);
  pbVar6 = (btVector3 *)info->m_J1angularAxis;
  a2.m_floats._0_8_ = a1.m_floats._0_8_ ^ 0x8000000080000000;
  a2.m_floats[2] = -a1.m_floats[2];
  a2.m_floats[3] = 0.0;
  btVector3::getSkewSymmetricMatrix
            (&a2,pbVar6,(btVector3 *)(pbVar6->m_floats + info->rowskip),
             (btVector3 *)(pbVar6->m_floats + (long)info->rowskip * 2));
  pbVar7 = info->m_J2linearAxis;
  *pbVar7 = -1.0;
  iVar4 = info->rowskip;
  pbVar7[(long)iVar4 + 1] = -1.0;
  pbVar7[(long)iVar4 * 2 + 2] = -1.0;
  a2 = operator*(&body1_trans->m_basis,&this->m_pivotInB);
  pbVar6 = (btVector3 *)info->m_J2angularAxis;
  btVector3::getSkewSymmetricMatrix
            (&a2,pbVar6,(btVector3 *)(pbVar6->m_floats + info->rowskip),
             (btVector3 *)(pbVar6->m_floats + (long)info->rowskip * 2));
  uVar5 = this->m_flags;
  pbVar7 = &this->m_erp;
  if ((uVar5 & 1) == 0) {
    pbVar7 = &info->erp;
  }
  fVar1 = *pbVar7;
  fVar2 = info->fps;
  pbVar7 = info->m_constraintError;
  iVar4 = info->rowskip;
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    *pbVar7 = (((a2.m_floats[lVar10] + (body1_trans->m_origin).m_floats[lVar10]) -
               a1.m_floats[lVar10]) - (body0_trans->m_origin).m_floats[lVar10]) * fVar1 * fVar2;
    pbVar7 = pbVar7 + iVar4;
  }
  if ((uVar5 & 2) != 0) {
    pbVar7 = info->cfm;
    lVar10 = 3;
    while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
      *pbVar7 = this->m_cfm;
      pbVar7 = pbVar7 + iVar4;
    }
  }
  bVar3 = (this->m_setting).m_impulseClamp;
  iVar8 = 3;
  iVar9 = 0;
  while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
    if (0.0 < (this->m_setting).m_impulseClamp) {
      info->m_lowerLimit[iVar9] = -bVar3;
      info->m_upperLimit[iVar9] = bVar3;
    }
    iVar9 = iVar9 + iVar4;
  }
  info->m_damping = (this->m_setting).m_damping;
  return;
}

Assistant:

void btPoint2PointConstraint::getInfo2NonVirtual (btConstraintInfo2* info, const btTransform& body0_trans, const btTransform& body1_trans)
{
	btAssert(!m_useSolveConstraintObsolete);

	 //retrieve matrices

	// anchor points in global coordinates with respect to body PORs.
   
    // set jacobian
    info->m_J1linearAxis[0] = 1;
	info->m_J1linearAxis[info->rowskip+1] = 1;
	info->m_J1linearAxis[2*info->rowskip+2] = 1;

	btVector3 a1 = body0_trans.getBasis()*getPivotInA();
	{
		btVector3* angular0 = (btVector3*)(info->m_J1angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J1angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J1angularAxis+2*info->rowskip);
		btVector3 a1neg = -a1;
		a1neg.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    
	info->m_J2linearAxis[0] = -1;
    info->m_J2linearAxis[info->rowskip+1] = -1;
    info->m_J2linearAxis[2*info->rowskip+2] = -1;
	
	btVector3 a2 = body1_trans.getBasis()*getPivotInB();
   
	{
	//	btVector3 a2n = -a2;
		btVector3* angular0 = (btVector3*)(info->m_J2angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J2angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J2angularAxis+2*info->rowskip);
		a2.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    


    // set right hand side
	btScalar currERP = (m_flags & BT_P2P_FLAGS_ERP) ? m_erp : info->erp;
    btScalar k = info->fps * currERP;
    int j;
	for (j=0; j<3; j++)
    {
        info->m_constraintError[j*info->rowskip] = k * (a2[j] + body1_trans.getOrigin()[j] - a1[j] - body0_trans.getOrigin()[j]);
		//printf("info->m_constraintError[%d]=%f\n",j,info->m_constraintError[j]);
    }
	if(m_flags & BT_P2P_FLAGS_CFM)
	{
		for (j=0; j<3; j++)
		{
			info->cfm[j*info->rowskip] = m_cfm;
		}
	}

	btScalar impulseClamp = m_setting.m_impulseClamp;//
	for (j=0; j<3; j++)
    {
		if (m_setting.m_impulseClamp > 0)
		{
			info->m_lowerLimit[j*info->rowskip] = -impulseClamp;
			info->m_upperLimit[j*info->rowskip] = impulseClamp;
		}
	}
	info->m_damping = m_setting.m_damping;
	
}